

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::expectSilentCastPossible
               (Context *context,ArrayView<soul::Type> targetTypes,Expression *source)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  int iVar4;
  Type *this;
  undefined1 in_R8B;
  Type *__begin2;
  Type *other;
  ArrayView<soul::Type> types;
  ArrayView<soul::Type> types_00;
  Type sourceType;
  string local_e0;
  string local_c0;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  types.s = targetTypes.e;
  (*(source->super_Statement).super_ASTObject._vptr_ASTObject[4])(&sourceType,source);
  iVar4 = 0;
  this = targetTypes.s;
  for (other = this; other != types.s; other = other + 1) {
    bVar1 = Type::isEqual(&sourceType,other,4);
    if (bVar1) goto LAB_002558ff;
    uVar2 = (*(source->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(source,other);
    iVar4 = iVar4 + (uVar2 & 0xff);
  }
  if (iVar4 != 1) {
    if (iVar4 == 0) {
      Type::getDescription_abi_cxx11_(&local_c0,&sourceType);
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      types.e = (Type *)0x0;
      heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
                (&local_e0,(Utilities *)this,types,(bool)in_R8B);
      Errors::cannotImplicitlyCastType<std::__cxx11::string,std::__cxx11::string>
                (&local_68,(Errors *)&local_c0,&local_e0,pbVar3);
      AST::Context::throwError(context,&local_68,false);
    }
    Type::getDescription_abi_cxx11_(&local_c0,&sourceType);
    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    types_00.e = (Type *)0x0;
    types_00.s = types.s;
    heart::Utilities::getDescriptionOfTypeList_abi_cxx11_
              (&local_e0,(Utilities *)this,types_00,(bool)in_R8B);
    Errors::ambiguousCastBetween<std::__cxx11::string,std::__cxx11::string>
              (&local_a0,(Errors *)&local_c0,&local_e0,pbVar3);
    AST::Context::throwError(context,&local_a0,false);
  }
LAB_002558ff:
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&sourceType.structure);
  return;
}

Assistant:

static void expectSilentCastPossible (const AST::Context& context, ArrayView<Type> targetTypes, AST::Expression& source)
    {
        auto sourceType = source.getResultType();

        int matches = 0;

        for (auto& type : targetTypes)
        {
            // If we have an exact match, it doesn't matter how many other types could be used silently
            if (sourceType.isEqual (type, Type::ignoreVectorSize1))
                return;

            if (source.canSilentlyCastTo (type))
                ++matches;
        }

        if (matches == 0)
            context.throwError (Errors::cannotImplicitlyCastType (sourceType.getDescription(),
                                                                  heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));

        if (matches > 1)
            context.throwError (Errors::ambiguousCastBetween (sourceType.getDescription(),
                                                              heart::Utilities::getDescriptionOfTypeList (targetTypes, false)));
    }